

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperEQ<char[51],std::__cxx11::string>
          (internal *this,char *lhs_expression,char *rhs_expression,char (*lhs) [51],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs_local;
  char (*lhs_local) [51];
  char *rhs_expression_local;
  char *lhs_expression_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  bVar1 = std::operator==(*lhs,rhs);
  if (bVar1) {
    testing::AssertionSuccess();
    sVar2.ptr_ = extraout_RDX;
  }
  else {
    AVar3 = CmpHelperEQFailure<char[51],std::__cxx11::string>
                      (this,lhs_expression,rhs_expression,lhs,rhs);
    sVar2 = AVar3.message_.ptr_;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}